

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int ll_searchpath(lua_State *L)

{
  char *pcVar1;
  char *path;
  char *sep;
  char *dirsep;
  char *f;
  lua_State *L_local;
  
  pcVar1 = luaL_checklstring(L,1,(size_t *)0x0);
  path = luaL_checklstring(L,2,(size_t *)0x0);
  sep = luaL_optlstring(L,3,".",(size_t *)0x0);
  dirsep = luaL_optlstring(L,4,"/",(size_t *)0x0);
  pcVar1 = searchpath(L,pcVar1,path,sep,dirsep);
  if (pcVar1 == (char *)0x0) {
    lua_pushnil(L);
    lua_rotate(L,-2,1);
    L_local._4_4_ = 2;
  }
  else {
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int ll_searchpath(lua_State *L) {
    const char *f = searchpath(L, luaL_checkstring(L, 1),
                               luaL_checkstring(L, 2),
                               luaL_optstring(L, 3, "."),
                               luaL_optstring(L, 4, LUA_DIRSEP));
    if (f != NULL) return 1;
    else {  /* error message is on top of the stack */
        lua_pushnil(L);
        lua_insert(L, -2);
        return 2;  /* return nil + error message */
    }
}